

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O0

void dequantize_row_iq2_xs(block_iq2_xs *x,float *y,int64_t k)

{
  byte bVar1;
  ushort uVar2;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  float fVar3;
  int j;
  uint8_t signs;
  uint8_t *grid;
  int l;
  int ib32;
  float d;
  int i;
  float db [2];
  int64_t nb;
  float local_4c;
  int local_48;
  int local_38;
  int local_34;
  int local_2c;
  float local_28 [2];
  long local_20;
  long local_10;
  long local_8;
  
  local_20 = in_RDX / 0x100;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_2c = 0; local_2c < local_20; local_2c = local_2c + 1) {
    fVar3 = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(local_8 + (long)local_2c * 0x4a));
    for (local_34 = 0; local_34 < 8; local_34 = local_34 + 1) {
      local_28[0] = fVar3 * ((float)(*(byte *)(local_8 + (long)local_2c * 0x4a + 0x42 +
                                              (long)local_34) & 0xf) + 0.5) * 0.25;
      local_28[1] = fVar3 * ((float)((int)(uint)*(byte *)(local_8 + (long)local_2c * 0x4a + 0x42 +
                                                         (long)local_34) >> 4) + 0.5) * 0.25;
      for (local_38 = 0; local_38 < 4; local_38 = local_38 + 1) {
        uVar2 = *(ushort *)
                 (local_8 + (long)local_2c * 0x4a + 2 + (long)(local_34 * 4 + local_38) * 2);
        bVar1 = ""[(int)(uint)*(ushort *)
                               (local_8 + (long)local_2c * 0x4a + 2 +
                               (long)(local_34 * 4 + local_38) * 2) >> 9];
        for (local_48 = 0; local_48 < 8; local_48 = local_48 + 1) {
          local_4c = -1.0;
          if ((bVar1 & kmask_iq2xs[local_48]) == 0) {
            local_4c = 1.0;
          }
          *(float *)(local_10 + (long)local_48 * 4) =
               local_28[local_38 / 2] *
               (float)*(byte *)((long)iq2xs_grid + (long)local_48 + (long)(int)(uVar2 & 0x1ff) * 8)
               * local_4c;
        }
        local_10 = local_10 + 0x20;
      }
    }
  }
  return;
}

Assistant:

void dequantize_row_iq2_xs(const block_iq2_xs * GGML_RESTRICT x, float * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int64_t nb = k / QK_K;

    float db[2];

    for (int i = 0; i < nb; i++) {

        const float d = GGML_FP16_TO_FP32(x[i].d);

        for (int ib32 = 0; ib32 < QK_K/32; ++ib32) {
            db[0] = d * (0.5f + (x[i].scales[ib32] & 0xf)) * 0.25f;
            db[1] = d * (0.5f + (x[i].scales[ib32] >>  4)) * 0.25f;
            for (int l = 0; l < 4; ++l) {
                const uint8_t * grid = (const uint8_t *)(iq2xs_grid + (x[i].qs[4*ib32 + l] & 511));
                const uint8_t  signs = ksigns_iq2xs[x[i].qs[4*ib32 + l] >> 9];
                for (int j = 0; j < 8; ++j) {
                    y[j] = db[l/2] * grid[j] * (signs & kmask_iq2xs[j] ? -1.f : 1.f);
                }
                y += 8;
            }
        }
    }
}